

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O2

uint64_t benchmark_index(int files,int file_size)

{
  TaskSpec *spec;
  long lVar1;
  long lVar2;
  string *dsname;
  pointer ppOVar3;
  initializer_list<IndexType> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator_type local_3e9;
  undefined1 local_3e8 [8];
  _Rb_tree_node_base _Stack_3e0;
  size_t local_3c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b8;
  vector<IndexType,_std::allocator<IndexType>_> index_types;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  Task task;
  path ursa_file;
  path test_path;
  set<DatabaseSnapshot_*,_std::less<DatabaseSnapshot_*>,_std::allocator<DatabaseSnapshot_*>_>
  working_snapshots;
  Database db;
  
  produce_test_files_abi_cxx11_(&test_path,files,file_size);
  std::experimental::filesystem::v1::temp_directory_path_abi_cxx11_((v1 *)&ursa_file);
  random_hex_string_abi_cxx11_((string *)&db,8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &working_snapshots,"ursabench_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&db);
  std::experimental::filesystem::v1::__cxx11::path::append<std::__cxx11::string>
            (&ursa_file,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&working_snapshots
            );
  std::__cxx11::string::~string((string *)&working_snapshots);
  std::__cxx11::string::~string((string *)&db);
  std::__cxx11::string::string((string *)&working_snapshots,(string *)&ursa_file);
  Database::create((string *)&working_snapshots);
  std::__cxx11::string::~string((string *)&working_snapshots);
  std::__cxx11::string::string((string *)&working_snapshots,(string *)&ursa_file);
  Database::Database(&db,(string *)&working_snapshots);
  std::__cxx11::string::~string((string *)&working_snapshots);
  lVar1 = std::chrono::_V2::steady_clock::now();
  Database::snapshot((DatabaseSnapshot *)&working_snapshots,&db);
  local_3e8._0_4_ = 1;
  __l._M_len = 1;
  __l._M_array = (iterator)local_3e8;
  std::vector<IndexType,_std::allocator<IndexType>_>::vector
            (&index_types,__l,(allocator_type *)&task);
  task.spec_ = Database::allocate_task(&db);
  task.changes_.super__Vector_base<DBChange,_std::allocator<DBChange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  task.changes_.super__Vector_base<DBChange,_std::allocator<DBChange>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  task.changes_.super__Vector_base<DBChange,_std::allocator<DBChange>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_3e0._M_left = &_Stack_3e0;
  local_3e8 = (undefined1  [8])0x0;
  _Stack_3e0._0_8_ = (pointer)0x0;
  _Stack_3e0._M_parent = (_Base_ptr)0x0;
  local_3c0 = 0;
  _Stack_3e0._M_right = _Stack_3e0._M_left;
  std::__cxx11::string::string((string *)&local_388,(string *)&test_path);
  __l_00._M_len = 1;
  __l_00._M_array = &local_388;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_3b8,__l_00,&local_3e9);
  DatabaseSnapshot::recursive_index_paths
            ((DatabaseSnapshot *)&working_snapshots,&task,&index_types,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_3e8,&local_3b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3b8);
  std::__cxx11::string::~string((string *)&local_388);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3e8);
  spec = task.spec_;
  std::vector<DBChange,_std::allocator<DBChange>_>::vector
            ((vector<DBChange,_std::allocator<DBChange>_> *)local_3e8,&task.changes_);
  Database::commit_task(&db,spec,(vector<DBChange,_std::allocator<DBChange>_> *)local_3e8);
  std::vector<DBChange,_std::allocator<DBChange>_>::~vector
            ((vector<DBChange,_std::allocator<DBChange>_> *)local_3e8);
  std::vector<DBChange,_std::allocator<DBChange>_>::~vector(&task.changes_);
  std::_Vector_base<IndexType,_std::allocator<IndexType>_>::~_Vector_base
            (&index_types.super__Vector_base<IndexType,_std::allocator<IndexType>_>);
  DatabaseSnapshot::~DatabaseSnapshot((DatabaseSnapshot *)&working_snapshots);
  lVar2 = std::chrono::_V2::steady_clock::now();
  for (ppOVar3 = db.working_datasets.
                 super__Vector_base<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppOVar3 !=
      db.working_datasets.super__Vector_base<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppOVar3 = ppOVar3 + 1) {
    dsname = OnDiskDataset::get_name_abi_cxx11_(*ppOVar3);
    Database::drop_dataset(&db,dsname);
  }
  working_snapshots._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &working_snapshots._M_t._M_impl.super__Rb_tree_header._M_header;
  working_snapshots._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  working_snapshots._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  working_snapshots._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  working_snapshots._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       working_snapshots._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Database::collect_garbage(&db,&working_snapshots);
  std::experimental::filesystem::v1::remove_all(&test_path);
  std::
  _Rb_tree<DatabaseSnapshot_*,_DatabaseSnapshot_*,_std::_Identity<DatabaseSnapshot_*>,_std::less<DatabaseSnapshot_*>,_std::allocator<DatabaseSnapshot_*>_>
  ::~_Rb_tree(&working_snapshots._M_t);
  Database::~Database(&db);
  std::experimental::filesystem::v1::__cxx11::path::~path(&ursa_file);
  std::experimental::filesystem::v1::__cxx11::path::~path(&test_path);
  return (lVar2 - lVar1) / 1000000;
}

Assistant:

uint64_t benchmark_index(int files, int file_size) {
    fs::path test_path = produce_test_files(files, file_size);

    fs::path ursa_file = fs::temp_directory_path();
    ursa_file /= "ursabench_" + random_hex_string(8);

    Database::create(ursa_file);
    Database db(ursa_file);
    uint64_t result = benchmark_ms([&db, &test_path]() {
        auto snap = db.snapshot();
        std::vector<IndexType> index_types = {IndexType::GRAM3};
        Task task = Task(db.allocate_task());
        snap.recursive_index_paths(&task, index_types, {}, {test_path});
        db.commit_task(task.spec(), task.changes());
    });
    for (auto ds : db.working_sets()) {
        db.drop_dataset(ds->get_name());
    }
    std::set<DatabaseSnapshot *> working_snapshots;
    db.collect_garbage(working_snapshots);
    fs::remove_all(test_path);
    return result;
}